

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O3

CURLcode glob_match_url(char **result,char *filename,URLGlob *glob)

{
  URLPatternType UVar1;
  char **ppcVar2;
  char *pcVar3;
  int iVar4;
  CURLcode CVar5;
  ulong uVar6;
  ulong uVar7;
  URLGlob *pUVar8;
  size_t len;
  char *pcVar9;
  char numbuf [18];
  dynbuf dyn;
  char *local_78;
  char **local_70;
  char local_68 [24];
  dynbuf local_50;
  
  *result = (char *)0x0;
  local_78 = filename;
  local_70 = result;
  curlx_dyn_init(&local_50,0x2800);
  pcVar9 = "";
  len = 0;
  do {
    pcVar3 = local_78;
    if (*local_78 == '#') {
      iVar4 = Curl_isdigit((uint)(byte)local_78[1]);
      if (((iVar4 != 0) && (uVar6 = strtoul(pcVar3 + 1,&local_78,10), uVar6 != 0)) &&
         (uVar7 = glob->size, uVar6 < uVar7)) {
        pUVar8 = glob;
        do {
          if (pUVar8->pattern[0].globindex == (int)uVar6 + -1) {
            UVar1 = pUVar8->pattern[0].type;
            if (UVar1 == UPTNumRange) {
              pcVar9 = local_68;
              curl_msnprintf(pcVar9,0x12,"%0*lu",pUVar8->pattern[0].content.NumRange.padlength,
                             pUVar8->pattern[0].content.NumRange.ptr_n);
            }
            else {
              if (UVar1 == UPTCharRange) {
                local_68[0] = pUVar8->pattern[0].content.CharRange.ptr_c;
                local_68[1] = 0;
                len = 1;
                pcVar9 = local_68;
                goto LAB_0011bed8;
              }
              if (UVar1 != UPTSet) {
                curl_mfprintf(_stderr,"internal error: invalid pattern type (%d)\n");
                curlx_dyn_free(&local_50);
                return CURLE_FAILED_INIT;
              }
              ppcVar2 = pUVar8->pattern[0].content.Set.elements;
              if (ppcVar2 == (char **)0x0) goto LAB_0011bed8;
              pcVar9 = ppcVar2[pUVar8->pattern[0].content.Set.ptr_s];
            }
            len = strlen(pcVar9);
            goto LAB_0011bed8;
          }
          pUVar8 = (URLGlob *)(pUVar8->pattern + 1);
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
    }
    else if (*local_78 == '\0') {
      pcVar9 = curlx_dyn_ptr(&local_50);
      *local_70 = pcVar9;
      return CURLE_OK;
    }
    local_78 = pcVar3 + 1;
    len = 1;
    pcVar9 = pcVar3;
LAB_0011bed8:
    CVar5 = curlx_dyn_addn(&local_50,pcVar9,len);
    if (CVar5 != CURLE_OK) {
      return CURLE_OUT_OF_MEMORY;
    }
  } while( true );
}

Assistant:

CURLcode glob_match_url(char **result, char *filename, struct URLGlob *glob)
{
  char numbuf[18];
  char *appendthis = (char *)"";
  size_t appendlen = 0;
  struct curlx_dynbuf dyn;

  *result = NULL;

  /* We cannot use the glob_buffer for storage since the filename may be
   * longer than the URL we use.
   */
  curlx_dyn_init(&dyn, MAX_OUTPUT_GLOB_LENGTH);

  while(*filename) {
    if(*filename == '#' && ISDIGIT(filename[1])) {
      char *ptr = filename;
      unsigned long num = strtoul(&filename[1], &filename, 10);
      struct URLPattern *pat = NULL;

      if(num && (num < glob->size)) {
        unsigned long i;
        num--; /* make it zero based */
        /* find the correct glob entry */
        for(i = 0; i<glob->size; i++) {
          if(glob->pattern[i].globindex == (int)num) {
            pat = &glob->pattern[i];
            break;
          }
        }
      }

      if(pat) {
        switch(pat->type) {
        case UPTSet:
          if(pat->content.Set.elements) {
            appendthis = pat->content.Set.elements[pat->content.Set.ptr_s];
            appendlen =
              strlen(pat->content.Set.elements[pat->content.Set.ptr_s]);
          }
          break;
        case UPTCharRange:
          numbuf[0] = pat->content.CharRange.ptr_c;
          numbuf[1] = 0;
          appendthis = numbuf;
          appendlen = 1;
          break;
        case UPTNumRange:
          msnprintf(numbuf, sizeof(numbuf), "%0*lu",
                    pat->content.NumRange.padlength,
                    pat->content.NumRange.ptr_n);
          appendthis = numbuf;
          appendlen = strlen(numbuf);
          break;
        default:
          fprintf(stderr, "internal error: invalid pattern type (%d)\n",
                  (int)pat->type);
          curlx_dyn_free(&dyn);
          return CURLE_FAILED_INIT;
        }
      }
      else {
        /* #[num] out of range, use the #[num] in the output */
        filename = ptr;
        appendthis = filename++;
        appendlen = 1;
      }
    }
    else {
      appendthis = filename++;
      appendlen = 1;
    }
    if(curlx_dyn_addn(&dyn, appendthis, appendlen))
      return CURLE_OUT_OF_MEMORY;
  }

#if defined(MSDOS) || defined(WIN32)
  {
    char *sanitized;
    SANITIZEcode sc = sanitize_file_name(&sanitized, curlx_dyn_ptr(&dyn),
                                         (SANITIZE_ALLOW_PATH |
                                          SANITIZE_ALLOW_RESERVED));
    curlx_dyn_free(&dyn);
    if(sc)
      return CURLE_URL_MALFORMAT;
    *result = sanitized;
    return CURLE_OK;
  }
#else
  *result = curlx_dyn_ptr(&dyn);
  return CURLE_OK;
#endif /* MSDOS || WIN32 */
}